

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmwCmpxchg<unsigned_long,unsigned_char>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  unsigned_long uVar4;
  Memory *this_01;
  string local_88;
  Ptr local_68;
  Enum local_4c;
  u32 local_48;
  byte local_43;
  uchar local_42;
  uchar local_41;
  u32 offset;
  uchar old;
  uchar expect;
  uchar replace;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  _offset = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,_offset);
  uVar4 = Pop<unsigned_long>(this);
  local_41 = (uchar)uVar4;
  uVar4 = Pop<unsigned_long>(this);
  local_42 = (uchar)uVar4;
  local_48 = Pop<unsigned_int>(this);
  this_01 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  local_4c = (Enum)Memory::AtomicRmwCmpxchg<unsigned_char>
                             (this_01,local_48,instr.field_2.imm_u32x2.snd,local_42,local_41,
                              &local_43);
  bVar2 = Failed((Result)local_4c);
  if (bVar2) {
    pSVar1 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_88,"invalid atomic access at %u+%u",(ulong)local_48,
               (ulong)instr.field_2.imm_u32x2.snd);
    Trap::New(&local_68,pSVar1,&local_88,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_68);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    Push<unsigned_long>(this,(ulong)local_43);
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoAtomicRmwCmpxchg(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V replace = static_cast<V>(Pop<T>());
  V expect = static_cast<V>(Pop<T>());
  V old;
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->AtomicRmwCmpxchg(offset, instr.imm_u32x2.snd, expect,
                                          replace, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(old));
  return RunResult::Ok;
}